

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

QRect __thiscall QRenderRule::contentsRect(QRenderRule *this,QRect *r)

{
  QStyleSheetBoxData *pQVar1;
  Representation RVar2;
  Representation RVar3;
  Representation RVar4;
  QRect QVar5;
  
  QVar5 = paddingRect(this,r);
  pQVar1 = (this->b).d.ptr;
  if (pQVar1 != (QStyleSheetBoxData *)0x0) {
    RVar2 = QVar5.x1.m_i;
    RVar3 = QVar5.x2.m_i;
    RVar4 = QVar5.y2.m_i;
    QVar5.y1.m_i = QVar5.y1.m_i.m_i + pQVar1->paddings[0];
    QVar5.x1.m_i = pQVar1->paddings[3] + RVar2.m_i;
    QVar5.y2.m_i = RVar4.m_i - pQVar1->paddings[2];
    QVar5.x2.m_i = RVar3.m_i - pQVar1->paddings[1];
  }
  return QVar5;
}

Assistant:

QRect QRenderRule::contentsRect(const QRect& r) const
{
    QRect pr = paddingRect(r);
    if (!hasBox())
        return pr;
    const int *p = box()->paddings;
    return pr.adjusted(p[LeftEdge], p[TopEdge], -p[RightEdge], -p[BottomEdge]);
}